

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_fast.cpp
# Opt level: O0

void crnlib::dxt_fast::compress_color_block
               (uint n,color_quad_u8 *block,uint *low16,uint *high16,uint8 *pSelectors,bool refine)

{
  bool bVar1;
  uint local_50;
  float local_4c;
  uint i;
  float axis [3];
  uint ave_color [3];
  bool refine_local;
  uint8 *pSelectors_local;
  uint *high16_local;
  uint *low16_local;
  color_quad_u8 *block_local;
  uint n_local;
  
  bVar1 = optimize_block_colors(n,block,low16,high16,(uint *)(axis + 1),&local_4c);
  if (bVar1) {
    bVar1 = determine_selectors(n,block,*low16,*high16,pSelectors);
    if (bVar1) {
      bVar1 = refine_block(n,block,low16,high16,pSelectors);
      if (bVar1) {
        determine_selectors(n,block,*low16,*high16,pSelectors);
      }
      if (refine) {
        refine_endpoints2(n,block,low16,high16,pSelectors,&local_4c);
      }
    }
    else {
      compress_solid_block(n,(uint *)(axis + 1),low16,high16,pSelectors);
    }
  }
  else {
    compress_solid_block(n,(uint *)(axis + 1),low16,high16,pSelectors);
  }
  if (*low16 < *high16) {
    std::swap<unsigned_int>(low16,high16);
    for (local_50 = 0; local_50 < n; local_50 = local_50 + 1) {
      pSelectors[local_50] = pSelectors[local_50] ^ 1;
    }
  }
  return;
}

Assistant:

void compress_color_block(uint n, const color_quad_u8* block, uint& low16, uint& high16, uint8* pSelectors, bool refine)
        {
            CRNLIB_ASSERT((n & 15) == 0);

            uint ave_color[3];
            float axis[3];

            if (!optimize_block_colors(n, block, low16, high16, ave_color, axis))
            {
                compress_solid_block(n, ave_color, low16, high16, pSelectors);
            }
            else
            {
                if (!determine_selectors(n, block, low16, high16, pSelectors))
                {
                    compress_solid_block(n, ave_color, low16, high16, pSelectors);
                }
                else
                {
                    if (refine_block(n, block, low16, high16, pSelectors))
                    {
                        determine_selectors(n, block, low16, high16, pSelectors);
                    }

                    if (refine)
                    {
                        refine_endpoints2(n, block, low16, high16, pSelectors, axis);
                    }
                }
            }

            if (low16 < high16)
            {
                std::swap(low16, high16);
                for (uint i = 0; i < n; i++)
                {
                    pSelectors[i] ^= 1;
                }
            }
        }